

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

bool __thiscall cmDebugger_impl::ClearWatchpoint(cmDebugger_impl *this,watchpoint_id id)

{
  bool bVar1;
  size_type sVar2;
  cmVariableWatch *this_00;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  undefined1 local_58 [8];
  shared_ptr<cmDebugger_impl::Watchpoint> watchpoint;
  size_type originalSize;
  _Self local_28;
  iterator watchpointIt;
  lock_guard<std::mutex> l;
  watchpoint_id id_local;
  cmDebugger_impl *this_local;
  
  l._M_device = (mutex_type *)id;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&watchpointIt,&this->breakpointMutex);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
       ::find(&this->activeWatchpoints,(key_type_conflict *)&l);
  sVar2 = std::
          map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
          ::size(&this->activeWatchpoints);
  watchpoint.super___shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
           ::end(&this->activeWatchpoints);
  bVar1 = std::operator!=(&local_28,
                          (_Self *)&watchpoint.
                                    super___shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>
    ::operator->(&local_28);
    std::weak_ptr<cmDebugger_impl::Watchpoint>::lock
              ((weak_ptr<cmDebugger_impl::Watchpoint> *)local_58);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      this_00 = cmake::GetVariableWatch(this->CMakeInstance);
      peVar3 = std::
               __shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      peVar4 = std::
               __shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      cmVariableWatch::RemoveWatch
                (this_00,&(peVar3->super_cmWatchpoint).Variable,WatchMethodCB,peVar4->user_data);
      std::
      map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
      ::erase(&this->activeWatchpoints,(key_type_conflict *)&l);
    }
    std::shared_ptr<cmDebugger_impl::Watchpoint>::~shared_ptr
              ((shared_ptr<cmDebugger_impl::Watchpoint> *)local_58);
  }
  sVar5 = std::
          map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
          ::size(&this->activeWatchpoints);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&watchpointIt);
  return sVar2 != sVar5;
}

Assistant:

bool ClearWatchpoint(watchpoint_id id) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto watchpointIt = activeWatchpoints.find(id);
    auto originalSize = activeWatchpoints.size();
    if (watchpointIt != activeWatchpoints.end()) {
      if (auto watchpoint = watchpointIt->second.lock()) {
        this->CMakeInstance.GetVariableWatch()->RemoveWatch(
          watchpoint->Variable, WatchMethodCB, watchpoint->user_data);
        activeWatchpoints.erase(id);
      }
    }

    return originalSize != activeWatchpoints.size();
  }